

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall
Executor::assertValueType(Executor *this,Value *value,TypeName *type,string *activity,Node *node)

{
  TypeName *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mapped_type *__rhs;
  TypeName *in_RDX;
  Value *in_RSI;
  Node *in_stack_00000128;
  string *in_stack_00000130;
  key_type *in_stack_ffffffffffffff28;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  pTVar1 = Value::getType(in_RSI);
  if (*pTVar1 != *in_RDX) {
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Value::getType(in_RSI);
    __rhs = std::
            unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    reportError(in_stack_00000130,in_stack_00000128);
  }
  return;
}

Assistant:

void Executor::assertValueType(const Value& value, const TypeName& type, const std::string& activity, const Node& node) const
{
  if(value.getType() != type)
    reportError("Cannot perform " + activity +
      " with value of type " + TypeNameStrings.at(value.getType()) + "!", node);
}